

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

int kj::anon_unknown_39::parseInteger<int>(StringPtr *s)

{
  int iVar1;
  int iVar2;
  longlong lVar3;
  longlong max;
  longlong min;
  StringPtr *s_local;
  
  iVar1 = MinValue_::operator_cast_to_int((MinValue_ *)&minValue);
  iVar2 = MaxValue_::operator_cast_to_int((MaxValue_ *)&maxValue);
  lVar3 = parseSigned(s,(long)iVar1,(long)iVar2);
  return (int)lVar3;
}

Assistant:

T parseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseUnsigned(s, max));
  }
}